

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O0

vector vector_copy(vector v)

{
  void *pvVar1;
  size_t *in_RDI;
  vector dest;
  vector local_8;
  
  if (in_RDI == (size_t *)0x0) {
    local_8 = (vector)0x0;
  }
  else {
    local_8 = (vector)malloc(0x20);
    if (local_8 == (vector)0x0) {
      log_write_impl_va("metacall",0x7a,"vector_copy",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,3,"Vector allocation error");
      local_8 = (vector)0x0;
    }
    else {
      pvVar1 = malloc(*in_RDI * in_RDI[1]);
      local_8->data = pvVar1;
      if (local_8->data == (void *)0x0) {
        log_write_impl_va("metacall",0x83,"vector_copy",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                          ,3,"Vector internal allocation error");
        free(local_8);
        local_8 = (vector)0x0;
      }
      else {
        local_8->capacity = in_RDI[1];
        local_8->size = in_RDI[2];
        local_8->type_size = *in_RDI;
        memcpy(local_8->data,(void *)in_RDI[3],local_8->size * local_8->type_size);
      }
    }
  }
  return local_8;
}

Assistant:

vector vector_copy(vector v)
{
	if (v != NULL)
	{
		vector dest = malloc(sizeof(struct vector_type));

		if (dest == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Vector allocation error");

			return NULL;
		}

		dest->data = malloc(v->type_size * v->capacity);

		if (dest->data == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Vector internal allocation error");

			free(dest);

			return NULL;
		}

		dest->capacity = v->capacity;
		dest->size = v->size;
		dest->type_size = v->type_size;

		memcpy(dest->data, v->data, dest->size * dest->type_size);

		return dest;
	}

	return NULL;
}